

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O1

Dims * adios2::query::split(Dims *__return_storage_ptr__,string *s,char delim)

{
  iterator __position;
  istream *piVar1;
  size_t val;
  string item;
  stringstream ss;
  stringstream curr;
  unsigned_long local_368;
  undefined1 *local_360;
  undefined8 local_358;
  undefined1 local_350 [16];
  stringstream local_340 [128];
  ios_base local_2c0 [264];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::stringstream::stringstream(local_340,(string *)s,_S_out|_S_in);
  local_360 = local_350;
  local_358 = 0;
  local_350[0] = 0;
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_340,(string *)&local_360,delim);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_360,_S_out|_S_in);
    std::istream::_M_extract<unsigned_long>((ulong *)local_1b8);
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                 __position,&local_368);
    }
    else {
      *__position._M_current = local_368;
      (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_360 != local_350) {
    operator_delete(local_360);
  }
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  return __return_storage_ptr__;
}

Assistant:

adios2::Dims split(const std::string &s, char delim)
{
    adios2::Dims dim;

    std::stringstream ss(s);
    std::string item;

    while (getline(ss, item, delim))
    {
        std::stringstream curr(item);
        size_t val;
        curr >> val;
        dim.push_back(val);
    }

    return dim;
}